

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O2

bool __thiscall BaseIndex::BlockUntilSyncedToCurrentChain(BaseIndex *this)

{
  __int_type_conflict2 _Var1;
  CBlockIndex *pCVar2;
  string_view source_file;
  bool bVar3;
  int iVar4;
  CBlockIndex *pCVar5;
  Logger *pLVar6;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  string local_70;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock14;
  undefined1 local_40;
  undefined8 local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  _Var1 = (this->m_synced)._M_base._M_i;
  if ((_Var1 & 1U) != 0) {
    args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x17f;
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock14,&cs_main,"cs_main",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/base.cpp"
               ,0x17f,false);
    pCVar2 = (this->m_chainstate->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1];
    pCVar5 = CBlockIndex::GetAncestor((this->m_best_block_index)._M_b._M_p,pCVar2->nHeight);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock14.super_unique_lock);
    if (pCVar5 != pCVar2) {
      pLVar6 = LogInstance();
      bVar3 = BCLog::Logger::Enabled(pLVar6);
      if (bVar3) {
        criticalblock14.super_unique_lock._M_device = (mutex_type *)&stack0xffffffffffffffc0;
        criticalblock14.super_unique_lock._M_owns = false;
        criticalblock14.super_unique_lock._9_7_ = 0;
        local_40 = '\0';
        tinyformat::format<char[31],std::__cxx11::string>
                  (&local_70,(tinyformat *)"%s: %s is catching up on block notifications\n",
                   "BlockUntilSyncedToCurrentChain",(char (*) [31])&this->m_name,args_1);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &criticalblock14,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        pLVar6 = LogInstance();
        local_70._M_dataplus._M_p = (pointer)0x57;
        local_70._M_string_length = 0xca4723;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/base.cpp"
        ;
        source_file._M_len = 0x57;
        str._M_str = (char *)criticalblock14.super_unique_lock._M_device;
        str._M_len = criticalblock14.super_unique_lock._8_8_;
        logging_function._M_str = "BlockUntilSyncedToCurrentChain";
        logging_function._M_len = 0x1e;
        BCLog::Logger::LogPrintStr(pLVar6,str,logging_function,source_file,0x187,ALL,Info);
        std::__cxx11::string::~string((string *)&criticalblock14);
      }
      iVar4 = (*((this->m_chain)._M_t.
                 super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
                 .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl)->_vptr_Chain[0x36]
              )();
      ValidationSignals::SyncWithValidationInterfaceQueue
                (*(ValidationSignals **)(CONCAT44(extraout_var,iVar4) + 0xe0));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (bool)(_Var1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool BaseIndex::BlockUntilSyncedToCurrentChain() const
{
    AssertLockNotHeld(cs_main);

    if (!m_synced) {
        return false;
    }

    {
        // Skip the queue-draining stuff if we know we're caught up with
        // m_chain.Tip().
        LOCK(cs_main);
        const CBlockIndex* chain_tip = m_chainstate->m_chain.Tip();
        const CBlockIndex* best_block_index = m_best_block_index.load();
        if (best_block_index->GetAncestor(chain_tip->nHeight) == chain_tip) {
            return true;
        }
    }

    LogPrintf("%s: %s is catching up on block notifications\n", __func__, GetName());
    m_chain->context()->validation_signals->SyncWithValidationInterfaceQueue();
    return true;
}